

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O3

StringTree * capnp::operator*(StringTree *__return_storage_ptr__,int64_t *param_2)

{
  int64_t iVar1;
  Reader local_98;
  int64_t local_50;
  size_t local_48;
  SegmentReader *local_40;
  CapTableReader *pCStack_38;
  byte *local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  
  iVar1 = *param_2;
  _::StructBuilder::asReader((StructBuilder *)(param_2 + 1));
  local_98.type = STRUCT;
  local_98.field_1.listValue.reader.segment = local_40;
  local_98.field_1.listValue.reader.capTable = pCStack_38;
  local_98.field_1.listValue.reader.ptr = local_30;
  local_98.field_1._40_8_ = uStack_28;
  local_98.field_1._48_8_ = local_20;
  local_98.field_1.textValue.super_StringPtr.content.size_ = local_48;
  local_98.field_1.intValue = iVar1;
  local_50 = iVar1;
  anon_unknown_2::print(__return_storage_ptr__,&local_98,STRUCT,(Indent)0x0,BARE);
  DynamicValue::Reader::~Reader(&local_98);
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree KJ_STRINGIFY(const DynamicStruct::Builder& value) { return stringify(value.asReader()); }